

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O2

bool __thiscall
ddd::DaTrie<true,_true,_true>::is_target_(DaTrie<true,_true,_true> *this,uint32_t base,Edge *edge)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  
  sVar1 = edge->size_;
  if (sVar1 == 0) {
    __assert_fail("0 < edge.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kampersanda[P]ddd/include/DaTrie.hpp"
                  ,0x3b7,
                  "bool ddd::DaTrie<true, true, true>::is_target_(uint32_t, const Edge &) const [WithBLM = true, WithNLM = true, Prefix = true]"
                 );
  }
  sVar2 = 0;
  do {
    sVar3 = sVar2;
    if (sVar1 == sVar3) break;
    sVar2 = sVar3 + 1;
  } while (-1 < (long)(this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
                      super__Vector_impl_data._M_start[edge->labels_[sVar3] ^ base]);
  return sVar1 == sVar3;
}

Assistant:

bool is_target_(uint32_t base, const Edge& edge) const {
    assert(0 < edge.size());

    for (auto label : edge) {
      auto child_pos = base ^label;
      if (bc_[child_pos].is_fixed()) {
        return false;
      }
    }
    return true;
  }